

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QHostAddress::setAddress(QHostAddress *this,QString *address)

{
  bool bVar1;
  QExplicitlySharedDataPointer<QHostAddressPrivate> *in_RSI;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(in_RSI);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x217119);
  bVar1 = QHostAddressPrivate::parse((QHostAddressPrivate *)this,address);
  return bVar1;
}

Assistant:

bool QHostAddress::setAddress(const QString &address)
{
    d.detach();
    return d->parse(address);
}